

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

fixup_entry * new_fixup(archive_write_disk *a,char *pathname)

{
  fixup_entry *pfVar1;
  char *pcVar2;
  
  pfVar1 = (fixup_entry *)calloc(1,0xb0);
  if (pfVar1 == (fixup_entry *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory for a fixup");
  }
  else {
    pfVar1->next = a->fixup_list;
    a->fixup_list = pfVar1;
    pcVar2 = strdup(pathname);
    pfVar1->name = pcVar2;
  }
  return pfVar1;
}

Assistant:

static struct fixup_entry *
new_fixup(struct archive_write_disk *a, const char *pathname)
{
	struct fixup_entry *fe;

	fe = calloc(1, sizeof(struct fixup_entry));
	if (fe == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for a fixup");
		return (NULL);
	}
	fe->next = a->fixup_list;
	a->fixup_list = fe;
	fe->fixup = 0;
	fe->filetype = 0;
	fe->name = strdup(pathname);
	return (fe);
}